

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  int *piVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow *window;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  int iVar15;
  ImU32 IVar16;
  uint uVar17;
  int iVar18;
  ImDrawList *pIVar19;
  ImGuiWindow *pIVar20;
  char cVar21;
  ImDrawList **ppIVar22;
  ImGuiContext *g;
  bool bVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ImGuiWindow *pIVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImVec4 local_48;
  
  pIVar12 = GImGui;
  iVar18 = GImGui->FrameCountEnded;
  if (iVar18 != GImGui->FrameCount) {
    EndFrame();
    iVar18 = pIVar12->FrameCount;
  }
  iVar3 = pIVar12->FrameCountRendered;
  pIVar12->FrameCountRendered = iVar18;
  (pIVar12->IO).MetricsRenderWindows = 0;
  iVar15 = (pIVar12->Hooks).Size;
  if (0 < iVar15) {
    lVar25 = 0;
    lVar26 = 0;
    do {
      pIVar4 = (pIVar12->Hooks).Data;
      if (*(int *)(pIVar4 + lVar25 + 4) == 4) {
        (**(code **)(pIVar4 + lVar25 + 0x10))(pIVar12);
        iVar15 = (pIVar12->Hooks).Size;
      }
      lVar26 = lVar26 + 1;
      lVar25 = lVar25 + 0x20;
    } while (lVar26 < iVar15);
  }
  if ((pIVar12->Viewports).Size != 0) {
    uVar24 = 0;
    do {
      pIVar5 = (pIVar12->Viewports).Data[uVar24];
      ImDrawDataBuilder::Clear(&pIVar5->DrawDataBuilder);
      if (pIVar5->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar19 = GetViewportDrawList(pIVar5,0,"##Background");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar19);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != (uint)(pIVar12->Viewports).Size);
  }
  pIVar13 = GImGui;
  if (iVar3 != iVar18) {
    pIVar20 = GetTopMostAndVisiblePopupModal();
    fVar30 = pIVar13->DimBgRatio;
    if ((0.0 < fVar30) || (0.0 < pIVar13->NavWindowingHighlightAlpha)) {
      pIVar27 = pIVar13->NavWindowingTargetAnim;
      if (pIVar27 == (ImGuiWindow *)0x0) {
        cVar21 = '\0';
      }
      else {
        cVar21 = pIVar27->Active;
      }
      if ((pIVar20 != (ImGuiWindow *)0x0) || (cVar21 != '\0')) {
        if (pIVar20 == (ImGuiWindow *)0x0) {
          if (cVar21 != '\0') {
            local_48.x = (pIVar13->Style).Colors[0x33].x;
            local_48.y = (pIVar13->Style).Colors[0x33].y;
            uVar8 = (pIVar13->Style).Colors[0x33].z;
            uVar9 = (pIVar13->Style).Colors[0x33].w;
            local_48.w = fVar30 * (pIVar13->Style).Alpha * (float)uVar9;
            local_48.z = (float)uVar8;
            IVar16 = ColorConvertFloat4ToU32(&local_48);
            RenderDimmedBackgroundBehindWindow(pIVar27,IVar16);
            pIVar20 = pIVar13->NavWindowingTargetAnim;
            pIVar5 = *(GImGui->Viewports).Data;
            fVar30 = pIVar13->FontSize;
            fVar28 = (pIVar20->Pos).x;
            fVar29 = (pIVar20->Pos).y;
            local_58.x = fVar28 - fVar30;
            local_58.y = fVar29 - fVar30;
            IStack_50.x = fVar30 + (pIVar20->Size).x + fVar28;
            IStack_50.y = fVar30 + (pIVar20->Size).y + fVar29;
            fVar28 = (pIVar5->super_ImGuiViewport).Size.x;
            if ((fVar28 <= IStack_50.x - local_58.x) &&
               ((pIVar5->super_ImGuiViewport).Size.y <= IStack_50.y - local_58.y)) {
              fVar30 = -1.0 - fVar30;
              local_58.x = local_58.x - fVar30;
              local_58.y = local_58.y - fVar30;
              IStack_50.x = fVar30 + IStack_50.x;
              IStack_50.y = fVar30 + IStack_50.y;
            }
            pIVar19 = pIVar20->DrawList;
            if ((pIVar19->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar19);
              pIVar19 = pIVar20->DrawList;
              fVar28 = (pIVar5->super_ImGuiViewport).Size.x;
            }
            IVar2 = (pIVar5->super_ImGuiViewport).Pos;
            local_48.y = (pIVar5->super_ImGuiViewport).Size.y + IVar2.y;
            local_48.x = fVar28 + IVar2.x;
            ImDrawList::PushClipRect
                      (pIVar19,&(pIVar5->super_ImGuiViewport).Pos,(ImVec2 *)&local_48,false);
            pIVar19 = pIVar20->DrawList;
            local_48.x = (GImGui->Style).Colors[0x32].x;
            local_48.y = (GImGui->Style).Colors[0x32].y;
            uVar10 = (GImGui->Style).Colors[0x32].z;
            uVar11 = (GImGui->Style).Colors[0x32].w;
            local_48.w = pIVar13->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar11
            ;
            local_48.z = (float)uVar10;
            IVar16 = ColorConvertFloat4ToU32(&local_48);
            ImDrawList::AddRect(pIVar19,&local_58,&IStack_50,IVar16,pIVar20->WindowRounding,0,3.0);
            ImDrawList::PopClipRect(pIVar20->DrawList);
          }
        }
        else {
          pIVar20 = FindBottomMostVisibleWindowWithinBeginStack(pIVar20);
          local_48.x = (pIVar13->Style).Colors[0x34].x;
          local_48.y = (pIVar13->Style).Colors[0x34].y;
          uVar6 = (pIVar13->Style).Colors[0x34].z;
          uVar7 = (pIVar13->Style).Colors[0x34].w;
          local_48.w = fVar30 * (pIVar13->Style).Alpha * (float)uVar7;
          local_48.z = (float)uVar6;
          IVar16 = ColorConvertFloat4ToU32(&local_48);
          RenderDimmedBackgroundBehindWindow(pIVar20,IVar16);
        }
      }
    }
  }
  pIVar20 = pIVar12->NavWindowingTarget;
  if (pIVar20 == (ImGuiWindow *)0x0) {
    pIVar20 = (ImGuiWindow *)0x0;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar20->Flags & 0x2000) == 0) {
      pIVar20 = pIVar20->RootWindow;
    }
    else {
      pIVar20 = (ImGuiWindow *)0x0;
    }
    pIVar27 = pIVar12->NavWindowingListWindow;
  }
  uVar17 = (pIVar12->Windows).Size;
  if (uVar17 != 0) {
    uVar24 = 0;
    do {
      window = (pIVar12->Windows).Data[uVar24];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar27 && window != pIVar20) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        uVar17 = (pIVar12->Windows).Size;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar17);
  }
  bVar14 = true;
  do {
    bVar23 = bVar14;
    if (((pIVar20 != (ImGuiWindow *)0x0) && (pIVar20->Active == true)) && (pIVar20->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar20,(uint)pIVar20->Flags >> 0x19 & 1);
    }
    pIVar20 = pIVar27;
    bVar14 = false;
  } while (bVar23);
  if ((((pIVar12->IO).MouseDrawCursor & iVar3 != iVar18) != 0) && (pIVar12->MouseCursor != -1)) {
    RenderMouseCursor((pIVar12->IO).MousePos,(pIVar12->Style).MouseCursorScale,pIVar12->MouseCursor,
                      0xffffffff,0xff000000,0x30000000);
  }
  (pIVar12->IO).MetricsRenderVertices = 0;
  (pIVar12->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar12->Viewports).Size) {
    lVar25 = 0;
    do {
      pIVar5 = (pIVar12->Viewports).Data[lVar25];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar5->DrawDataBuilder);
      if (pIVar5->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar19 = GetViewportDrawList(pIVar5,1,"##Foreground");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar19);
      }
      pIVar13 = GImGui;
      (pIVar5->DrawDataP).Valid = true;
      iVar18 = (pIVar5->DrawDataBuilder).Layers[0].Size;
      if (iVar18 < 1) {
        ppIVar22 = (ImDrawList **)0x0;
      }
      else {
        ppIVar22 = (pIVar5->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar5->DrawDataP).CmdLists = ppIVar22;
      (pIVar5->DrawDataP).CmdListsCount = iVar18;
      (pIVar5->DrawDataP).TotalIdxCount = 0;
      (pIVar5->DrawDataP).TotalVtxCount = 0;
      IVar2 = (pIVar5->super_ImGuiViewport).Size;
      (pIVar5->DrawDataP).DisplayPos = (pIVar5->super_ImGuiViewport).Pos;
      (pIVar5->DrawDataP).DisplaySize = IVar2;
      (pIVar5->DrawDataP).FramebufferScale = (pIVar13->IO).DisplayFramebufferScale;
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      else {
        lVar26 = 0;
        do {
          pIVar19 = (pIVar5->DrawDataBuilder).Layers[0].Data[lVar26];
          ImDrawList::_PopUnusedDrawCmd(pIVar19);
          iVar18 = (pIVar5->DrawDataP).TotalVtxCount + (pIVar19->VtxBuffer).Size;
          (pIVar5->DrawDataP).TotalVtxCount = iVar18;
          piVar1 = &(pIVar5->DrawDataP).TotalIdxCount;
          *piVar1 = *piVar1 + (pIVar19->IdxBuffer).Size;
          lVar26 = lVar26 + 1;
        } while (lVar26 < (pIVar5->DrawDataBuilder).Layers[0].Size);
      }
      piVar1 = &(pIVar12->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar18;
      piVar1 = &(pIVar12->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + (pIVar5->DrawDataP).TotalIdxCount;
      lVar25 = lVar25 + 1;
    } while (lVar25 < (pIVar12->Viewports).Size);
  }
  iVar18 = (pIVar12->Hooks).Size;
  if (0 < iVar18) {
    lVar25 = 0;
    lVar26 = 0;
    do {
      pIVar4 = (pIVar12->Hooks).Data;
      if (*(int *)(pIVar4 + lVar25 + 4) == 5) {
        (**(code **)(pIVar4 + lVar25 + 0x10))(pIVar12,pIVar4 + lVar25);
        iVar18 = (pIVar12->Hooks).Size;
      }
      lVar26 = lVar26 + 1;
      lVar25 = lVar25 + 0x20;
    } while (lVar26 < iVar18);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}